

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
__thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
::pop(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
      *this)

{
  long in_RSI;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *in_RDI;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *res;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *this_00;
  
  *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + -8;
  this_00 = in_RDI;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>::
  VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                   *)in_RDI,
                  *(VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                    **)(in_RSI + 0x10));
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>::
  ~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                    *)this_00);
  return (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
          )in_RDI;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }